

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QNetworkRequest::KnownHeaders,QVariant>::emplace_helper<QVariant_const&>
          (QHash<QNetworkRequest::KnownHeaders,QVariant> *this,KnownHeaders *key,QVariant *args)

{
  piter pVar1;
  Node<QNetworkRequest::KnownHeaders,QVariant> *this_00;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_>::
  findOrInsert<QNetworkRequest::KnownHeaders>
            ((InsertionResult *)local_38,
             *(Data<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_> **)this,key);
  this_00 = (Node<QNetworkRequest::KnownHeaders,QVariant> *)
            ((((*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries)->storage).
             data + (uint)(*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
                          [(uint)local_38._8_8_ & 0x7f] * 0x28);
  if (local_38[0x10] == false) {
    *(KnownHeaders *)this_00 = *key;
    QVariant::QVariant((QVariant *)(this_00 + 8),args);
  }
  else {
    QHashPrivate::Node<QNetworkRequest::KnownHeaders,QVariant>::emplaceValue<QVariant_const&>
              (this_00,args);
  }
  pVar1.bucket = local_38._8_8_;
  pVar1.d = (Data<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar1;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }